

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerGLSL::fixup_type_alias(CompilerGLSL *this)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  Variant *pVVar4;
  bool bVar5;
  SPIRType *type;
  SPIRType *pSVar6;
  long lVar7;
  TypedID<(spirv_cross::Types)0> *pTVar8;
  TypedID<(spirv_cross::Types)0> *pTVar9;
  ParsedIR *this_00;
  LoopLock loop_lock;
  LoopLock local_60;
  LoopLock local_58;
  TypedID<(spirv_cross::Types)0> *local_50;
  ParsedIR *local_48;
  TypedID<(spirv_cross::Types)0> *local_40;
  TypedID<(spirv_cross::Types)0> *local_38;
  
  this_00 = &(this->super_Compiler).ir;
  ParsedIR::create_loop_hard_lock(this_00);
  sVar3 = (this->super_Compiler).ir.ids_for_type[1].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar3 != 0) {
    pTVar9 = (this->super_Compiler).ir.ids_for_type[1].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    pTVar8 = pTVar9 + sVar3;
    local_50 = pTVar8;
    local_48 = this_00;
    do {
      uVar1 = pTVar9->id;
      pVVar4 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[uVar1].type == TypeType) {
        type = Variant::get<spirv_cross::SPIRType>(pVVar4 + uVar1);
        if ((type->type_alias).id != 0) {
          bVar5 = Compiler::has_decoration
                            (&this->super_Compiler,(ID)(type->super_IVariant).self.id,
                             DecorationBlock);
          if (!bVar5) {
            bVar5 = Compiler::has_decoration
                              (&this->super_Compiler,(ID)(type->super_IVariant).self.id,
                               DecorationBufferBlock);
            if (!bVar5) {
              bVar5 = Compiler::type_is_block_like(&this->super_Compiler,type);
              if (!bVar5 || (type->super_IVariant).self.id != uVar1) goto LAB_001cf7e0;
              ParsedIR::create_loop_hard_lock(this_00);
              sVar3 = (this->super_Compiler).ir.ids_for_type[1].
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
              if (sVar3 != 0) {
                pTVar8 = (this->super_Compiler).ir.ids_for_type[1].
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
                lVar7 = 0;
                local_40 = pTVar8;
                local_38 = pTVar9;
                do {
                  uVar2 = *(uint *)((long)&pTVar8->id + lVar7);
                  pVVar4 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
                  if (pVVar4[uVar2].type == TypeType) {
                    pSVar6 = Variant::get<spirv_cross::SPIRType>(pVVar4 + uVar2);
                    pTVar8 = local_40;
                    pTVar9 = local_38;
                    if ((uVar2 != uVar1) && ((pSVar6->type_alias).id == (type->type_alias).id)) {
                      (pSVar6->type_alias).id = uVar1;
                    }
                  }
                  lVar7 = lVar7 + 4;
                } while (sVar3 << 2 != lVar7);
              }
              ParsedIR::LoopLock::~LoopLock(&local_58);
              pSVar6 = Variant::get<spirv_cross::SPIRType>
                                 ((this->super_Compiler).ir.ids.
                                  super_VectorView<spirv_cross::Variant>.ptr + (type->type_alias).id
                                 );
              (pSVar6->type_alias).id = uVar1;
              pTVar8 = local_50;
              this_00 = local_48;
            }
          }
          (type->type_alias).id = 0;
        }
      }
LAB_001cf7e0:
      pTVar9 = pTVar9 + 1;
    } while (pTVar9 != pTVar8);
  }
  ParsedIR::LoopLock::~LoopLock(&local_60);
  return;
}

Assistant:

void CompilerGLSL::fixup_type_alias()
{
	// Due to how some backends work, the "master" type of type_alias must be a block-like type if it exists.
	ir.for_each_typed_id<SPIRType>([&](uint32_t self, SPIRType &type) {
		if (!type.type_alias)
			return;

		if (has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock))
		{
			// Top-level block types should never alias anything else.
			type.type_alias = 0;
		}
		else if (type_is_block_like(type) && type.self == ID(self))
		{
			// A block-like type is any type which contains Offset decoration, but not top-level blocks,
			// i.e. blocks which are placed inside buffers.
			// Become the master.
			ir.for_each_typed_id<SPIRType>([&](uint32_t other_id, SPIRType &other_type) {
				if (other_id == self)
					return;

				if (other_type.type_alias == type.type_alias)
					other_type.type_alias = self;
			});

			this->get<SPIRType>(type.type_alias).type_alias = self;
			type.type_alias = 0;
		}
	});
}